

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapepiram.cpp
# Opt level: O1

void pzshape::TPZShapePiram::ShapeInternal
               (TPZVec<double> *x,int order,TPZFMatrix<double> *phi,TPZFMatrix<double> *dphi)

{
  double *pdVar1;
  ulong uVar2;
  ulong uVar3;
  int k;
  ulong uVar4;
  long lVar5;
  int iVar6;
  int j;
  uint uVar7;
  ulong uVar8;
  TPZFNMatrix<20,_double> phi2;
  TPZFNMatrix<20,_double> phi1;
  TPZFNMatrix<20,_double> phi0;
  TPZFNMatrix<20,_double> dphi2;
  TPZFNMatrix<20,_double> dphi1;
  TPZFNMatrix<20,_double> dphi0;
  ulong local_7b8;
  TPZFMatrix<double> local_780;
  double local_6f0 [21];
  TPZFMatrix<double> local_648;
  double local_5b8 [21];
  TPZFMatrix<double> local_510;
  double local_480 [21];
  TPZFMatrix<double> local_3d8;
  double local_348 [21];
  TPZFMatrix<double> local_2a0;
  double local_210 [21];
  TPZFMatrix<double> local_168;
  double local_d8 [21];
  
  if (2 < order) {
    uVar7 = order - 2;
    uVar2 = (ulong)uVar7;
    local_510.fElem = local_480;
    local_510.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 1;
    local_510.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
    local_510.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
    local_510.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFMatrix_0183e5a0;
    local_510.fSize = 0x14;
    local_510.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = uVar2;
    local_510.fGiven = local_510.fElem;
    TPZVec<int>::TPZVec(&local_510.fPivot.super_TPZVec<int>,0);
    local_510.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
    local_510.fPivot.super_TPZVec<int>.fStore = local_510.fPivot.fExtAlloc;
    local_510.fPivot.super_TPZVec<int>.fNElements = 0;
    local_510.fPivot.super_TPZVec<int>.fNAlloc = 0;
    local_510.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
    local_510.fWork.fStore = (double *)0x0;
    local_510.fWork.fNElements = 0;
    local_510.fWork.fNAlloc = 0;
    pdVar1 = (double *)0x0;
    if ((uVar7 != 0) && (pdVar1 = local_510.fElem, 0x14 < uVar7)) {
      pdVar1 = (double *)operator_new__(uVar2 * 8);
    }
    local_510.fElem = pdVar1;
    local_510.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFNMatrix_0183e2b0;
    local_648.fElem = local_5b8;
    local_648.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 1;
    local_648.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
    local_648.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
    local_648.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFMatrix_0183e5a0;
    local_648.fSize = 0x14;
    local_648.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = uVar2;
    local_648.fGiven = local_648.fElem;
    TPZVec<int>::TPZVec(&local_648.fPivot.super_TPZVec<int>,0);
    local_648.fPivot.super_TPZVec<int>.fStore = local_648.fPivot.fExtAlloc;
    local_648.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
    local_648.fPivot.super_TPZVec<int>.fNElements = 0;
    local_648.fPivot.super_TPZVec<int>.fNAlloc = 0;
    local_648.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
    local_648.fWork.fStore = (double *)0x0;
    local_648.fWork.fNElements = 0;
    local_648.fWork.fNAlloc = 0;
    if (uVar2 == 0) {
      local_648.fElem = (double *)0x0;
    }
    else if (0x14 < uVar7) {
      local_648.fElem = (double *)operator_new__(uVar2 * 8);
    }
    local_648.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFNMatrix_0183e2b0;
    local_780.fElem = local_6f0;
    local_780.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 1;
    local_780.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
    local_780.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
    local_780.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFMatrix_0183e5a0;
    local_780.fSize = 0x14;
    local_780.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = uVar2;
    local_780.fGiven = local_780.fElem;
    TPZVec<int>::TPZVec(&local_780.fPivot.super_TPZVec<int>,0);
    local_780.fPivot.super_TPZVec<int>.fStore = local_780.fPivot.fExtAlloc;
    local_780.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
    local_780.fPivot.super_TPZVec<int>.fNElements = 0;
    local_780.fPivot.super_TPZVec<int>.fNAlloc = 0;
    local_780.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
    local_780.fWork.fStore = (double *)0x0;
    local_780.fWork.fNElements = 0;
    local_780.fWork.fNAlloc = 0;
    if (uVar2 == 0) {
      local_780.fElem = (double *)0x0;
    }
    else if (0x14 < uVar7) {
      local_780.fElem = (double *)operator_new__(uVar2 * 8);
    }
    local_780.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFNMatrix_0183e2b0;
    local_168.fElem = local_d8;
    local_168.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 1;
    local_168.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
    local_168.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
    local_168.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFMatrix_0183e5a0;
    local_168.fSize = 0x14;
    local_168.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = uVar2;
    local_168.fGiven = local_168.fElem;
    TPZVec<int>::TPZVec(&local_168.fPivot.super_TPZVec<int>,0);
    local_168.fPivot.super_TPZVec<int>.fStore = local_168.fPivot.fExtAlloc;
    local_168.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
    local_168.fPivot.super_TPZVec<int>.fNElements = 0;
    local_168.fPivot.super_TPZVec<int>.fNAlloc = 0;
    local_168.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
    local_168.fWork.fStore = (double *)0x0;
    local_168.fWork.fNElements = 0;
    local_168.fWork.fNAlloc = 0;
    if (uVar2 == 0) {
      local_168.fElem = (double *)0x0;
    }
    else if (0x14 < uVar7) {
      local_168.fElem = (double *)operator_new__(uVar2 * 8);
    }
    local_168.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFNMatrix_0183e2b0;
    local_2a0.fElem = local_210;
    local_2a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 1;
    local_2a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
    local_2a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
    local_2a0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFMatrix_0183e5a0;
    local_2a0.fSize = 0x14;
    local_2a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = uVar2;
    local_2a0.fGiven = local_2a0.fElem;
    TPZVec<int>::TPZVec(&local_2a0.fPivot.super_TPZVec<int>,0);
    local_2a0.fPivot.super_TPZVec<int>.fStore = local_2a0.fPivot.fExtAlloc;
    local_2a0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
    local_2a0.fPivot.super_TPZVec<int>.fNElements = 0;
    local_2a0.fPivot.super_TPZVec<int>.fNAlloc = 0;
    local_2a0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
    local_2a0.fWork.fStore = (double *)0x0;
    local_2a0.fWork.fNElements = 0;
    local_2a0.fWork.fNAlloc = 0;
    if (uVar2 == 0) {
      local_2a0.fElem = (double *)0x0;
    }
    else if (0x14 < uVar7) {
      local_2a0.fElem = (double *)operator_new__(uVar2 * 8);
    }
    local_2a0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFNMatrix_0183e2b0;
    local_3d8.fElem = local_348;
    local_3d8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 1;
    local_3d8.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
    local_3d8.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
    local_3d8.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFMatrix_0183e5a0;
    local_3d8.fSize = 0x14;
    local_3d8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = uVar2;
    local_3d8.fGiven = local_3d8.fElem;
    TPZVec<int>::TPZVec(&local_3d8.fPivot.super_TPZVec<int>,0);
    local_3d8.fPivot.super_TPZVec<int>.fStore = local_3d8.fPivot.fExtAlloc;
    local_3d8.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
    local_3d8.fPivot.super_TPZVec<int>.fNElements = 0;
    local_3d8.fPivot.super_TPZVec<int>.fNAlloc = 0;
    local_3d8.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
    local_3d8.fWork.fStore = (double *)0x0;
    local_3d8.fWork.fNElements = 0;
    local_3d8.fWork.fNAlloc = 0;
    if (uVar2 == 0) {
      local_3d8.fElem = (double *)0x0;
    }
    else if (0x14 < uVar7) {
      local_3d8.fElem = (double *)operator_new__(uVar2 * 8);
    }
    local_3d8.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFNMatrix_0183e2b0;
    (*(code *)TPZShapeLinear::fOrthogonal)(*x->fStore,uVar7,&local_510,&local_168);
    (*(code *)TPZShapeLinear::fOrthogonal)(x->fStore[1],uVar7,&local_648,&local_2a0);
    (*(code *)TPZShapeLinear::fOrthogonal)
              (x->fStore[2] + x->fStore[2] + -1.0,uVar7,&local_780,&local_3d8);
    uVar2 = 1;
    if (1 < (int)uVar7) {
      uVar2 = (ulong)uVar7;
    }
    uVar3 = 0;
    iVar6 = 0;
    do {
      uVar8 = 0;
      local_7b8 = uVar3;
      do {
        uVar4 = 0;
        do {
          if ((long)(local_7b8 + uVar4) < (long)(int)uVar7) {
            if ((local_510.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)uVar3) ||
               (local_510.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            if ((local_648.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)uVar8) ||
               (local_648.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            if ((local_780.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)uVar4) ||
               (local_780.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            lVar5 = (long)iVar6;
            if (((iVar6 < 0) || ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar5))
               || ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            phi->fElem[lVar5] =
                 local_510.fElem[uVar3] * local_648.fElem[uVar8] * local_780.fElem[uVar4];
            if ((local_168.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 1) ||
               (local_168.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= (long)uVar3)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            if ((local_648.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)uVar8) ||
               (local_648.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            if ((local_780.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)uVar4) ||
               (local_780.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            if ((((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 1) || (iVar6 < 0)) ||
               ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar5)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            dphi->fElem[(dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * lVar5] =
                 local_168.fElem[local_168.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * uVar3]
                 * local_648.fElem[uVar8] * local_780.fElem[uVar4];
            if ((local_510.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)uVar3) ||
               (local_510.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            if ((local_2a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 1) ||
               (local_2a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= (long)uVar8)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            if ((local_780.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)uVar4) ||
               (local_780.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            if ((((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 2) || (iVar6 < 0)) ||
               ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar5)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            dphi->fElem[(dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * lVar5 + 1] =
                 local_510.fElem[uVar3] *
                 local_2a0.fElem[local_2a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * uVar8]
                 * local_780.fElem[uVar4];
            if ((local_510.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)uVar3) ||
               (local_510.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            if ((local_648.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)uVar8) ||
               (local_648.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            if ((local_3d8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 1) ||
               (local_3d8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= (long)uVar4)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            if ((((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 3) || (iVar6 < 0)) ||
               ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar5)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            dphi->fElem[lVar5 * (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow + 2] =
                 (local_510.fElem[uVar3] + local_510.fElem[uVar3]) * local_648.fElem[uVar8] *
                 local_3d8.fElem[local_3d8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * uVar4]
            ;
            iVar6 = iVar6 + 1;
          }
          uVar4 = uVar4 + 1;
        } while (uVar2 != uVar4);
        uVar8 = uVar8 + 1;
        local_7b8 = local_7b8 + 1;
      } while (uVar8 != uVar2);
      uVar3 = uVar3 + 1;
    } while (uVar3 != uVar2);
    TPZFMatrix<double>::~TPZFMatrix(&local_3d8,&PTR_PTR_0183e568);
    TPZFMatrix<double>::~TPZFMatrix(&local_2a0,&PTR_PTR_0183e568);
    TPZFMatrix<double>::~TPZFMatrix(&local_168,&PTR_PTR_0183e568);
    TPZFMatrix<double>::~TPZFMatrix(&local_780,&PTR_PTR_0183e568);
    TPZFMatrix<double>::~TPZFMatrix(&local_648,&PTR_PTR_0183e568);
    TPZFMatrix<double>::~TPZFMatrix(&local_510,&PTR_PTR_0183e568);
  }
  return;
}

Assistant:

void TPZShapePiram::ShapeInternal(TPZVec<REAL> &x, int order,TPZFMatrix<REAL> &phi,
									  TPZFMatrix<REAL> &dphi) {
		// calculate the values of the function and derivatives of the product of the orthogonal functions
		if(order < 3) return;
		int ord = order-2;
		TPZFNMatrix<20, REAL> phi0(ord,1),phi1(ord,1),phi2(ord,1),
		dphi0(1,ord),dphi1(1,ord),dphi2(1,ord);
		TPZShapeLinear::fOrthogonal(x[0],ord,phi0,dphi0);//f e df            -1<=x0<=1
		TPZShapeLinear::fOrthogonal(x[1],ord,phi1,dphi1);//g e dg            -1<=x1<=1
		TPZShapeLinear::fOrthogonal(2.*x[2]-1.,ord,phi2,dphi2);//h e dh       0<=x3<=1 -> -1<=2*x2-1<=1
		int index = 0;   // integration point internal to pyramid
		for (int i=0;i<ord;i++) {
			for (int j=0;j<ord;j++) {
				for (int k=0;k<ord;k++) {
					if( i+j+k < ord ) {
						//int index = ord*(ord*i+j)+k; //i,j,k � o grau das fun��es ortogonais
						phi(index,0) =    phi0(i,0)* phi1(j,0)* phi2(k,0);
						dphi(0,index) =   dphi0(0,i)* phi1(j,0)* phi2(k,0);
						dphi(1,index) =    phi0(i,0)*dphi1(0,j)* phi2(k,0);
						dphi(2,index) = 2.*phi0(i,0)* phi1(j,0)*dphi2(0,k);
						index++;
					}
				}
			}
		}
	}